

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O3

void __thiscall
polyscope::CurveNetwork::CurveNetwork
          (CurveNetwork *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *nodes_,vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                  *edges_)

{
  ManagedBufferRegistry *registry_;
  undefined8 *puVar1;
  undefined1 *this_00;
  ManagedBuffer<unsigned_int> *this_01;
  pointer pcVar2;
  pointer puVar3;
  ulong __val;
  ulong __val_00;
  pointer puVar4;
  bool bVar5;
  pointer pvVar6;
  vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_> *pvVar7;
  char cVar8;
  char cVar9;
  long *plVar10;
  size_t sVar11;
  undefined8 *puVar12;
  pointer paVar13;
  size_type *psVar14;
  long *plVar15;
  ulong *puVar16;
  pointer paVar17;
  ulong uVar18;
  size_t sVar19;
  undefined8 uVar20;
  ulong uVar21;
  ulong __val_01;
  vec3 value_;
  string __str_3;
  string __str_2;
  string __str_1;
  string __str;
  string local_2f8;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_2d8;
  string local_2d0;
  ManagedBuffer<unsigned_int> *local_2b0;
  undefined1 *local_2a8;
  undefined **local_2a0;
  CurveNetwork *local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  string *local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_278;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  ulong *local_210;
  uint local_208;
  undefined4 uStack_204;
  ulong local_200 [2];
  ulong *local_1f0;
  uint local_1e8;
  undefined4 uStack_1e4;
  ulong local_1e0 [2];
  ulong *local_1d0;
  uint local_1c8;
  undefined4 uStack_1c4;
  ulong local_1c0 [2];
  ulong *local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  ulong local_1a0 [2];
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
  *local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_128;
  string local_120;
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_100;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_f8;
  ManagedBuffer<unsigned_int> *local_f0;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_e8;
  string *local_e0;
  _Any_data local_d8;
  code *pcStack_c8;
  code *pcStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_130 = edges_;
  WeakReferrable::WeakReferrable((WeakReferrable *)&this->field_0x950);
  (this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure =
       (_func_int **)0x5f4b20;
  *(undefined8 *)&this->field_0x950 = 0x5f4bc0;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_e0 = name;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
  (*(this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure[0xd])
            (&local_50,this);
  QuantityStructure<polyscope::CurveNetwork>::QuantityStructure
            (&this->super_QuantityStructure<polyscope::CurveNetwork>,
             &PTR_construction_vtable_24__005f4bd8,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure =
       (_func_int **)0x5f4b20;
  *(undefined8 *)&this->field_0x950 = 0x5f4bc0;
  Structure::uniquePrefix_abi_cxx11_(&local_2d0,(Structure *)this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  this_00 = &(this->super_QuantityStructure<polyscope::CurveNetwork>).field_0x428;
  registry_ = &(this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure.
               super_ManagedBufferRegistry;
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_2f8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00,registry_,&local_2f8,
             &this->nodePositionsData);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_2d0,(Structure *)this);
  local_e8 = &this->nodePositionsData;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  this_01 = &this->edgeTailInds;
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_2f8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_280 = &this->edgeTailIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer(this_01,registry_,&local_2f8,local_280);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_2d0,(Structure *)this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  local_f0 = &this->edgeTipInds;
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_2f8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_278 = &this->edgeTipIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer(local_f0,registry_,&local_2f8,local_278);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_2d0,(Structure *)this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_2f8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  pcStack_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = operator_new(0x18);
  local_2d8 = &this->edgeCenters;
  local_f8 = &this->edgeCentersData;
  *(code **)local_d8._M_unused._0_8_ = computeEdgeCenters;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0;
  pcStack_c0 = std::
               _Function_handler<void_(),_std::_Bind<void_(polyscope::CurveNetwork::*(polyscope::CurveNetwork_*))()>_>
               ::_M_invoke;
  *(CurveNetwork **)((long)local_d8._M_unused._0_8_ + 0x10) = this;
  pcStack_c8 = std::
               _Function_handler<void_(),_std::_Bind<void_(polyscope::CurveNetwork::*(polyscope::CurveNetwork_*))()>_>
               ::_M_manager;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_2d8,registry_,&local_2f8,local_f8,(function<void_()> *)&local_d8);
  if (pcStack_c8 != (code *)0x0) {
    (*pcStack_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_128 = &this->nodeDegrees;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar6 = (nodes_->
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->nodePositionsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (nodes_->
       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->nodePositionsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar6;
  (this->nodePositionsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (nodes_->
       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (nodes_->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (nodes_->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (nodes_->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_280 + 2))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [64])local_280 = ZEXT464(0) << 0x40;
  Structure::uniquePrefix_abi_cxx11_(&local_2d0,(Structure *)this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  pvVar7 = local_130;
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_2f8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  value_ = getNextUniqueColor();
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->color,&local_2f8,value_);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_2d0,(Structure *)this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar14;
    local_2f8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_2f8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  PersistentValue<polyscope::ScaledValue<float>_>::PersistentValue
            (&this->radius,&local_2f8,(ScaledValue<float>)0x3ba3d70a00000001);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_2d0,(Structure *)this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  plVar15 = plVar10 + 2;
  if ((long *)*plVar10 == plVar15) {
    local_2f8.field_2._M_allocated_capacity = *plVar15;
    local_2f8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *plVar15;
    local_2f8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_2f8._M_string_length = plVar10[1];
  *plVar10 = (long)plVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clay","");
  local_100 = &this->material;
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::PersistentValue(local_100,&local_2f8,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_290 = &(this->nodeRadiusQuantityName).field_2;
  local_288 = &this->nodeRadiusQuantityName;
  (this->edgeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->edgeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nodeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->edgePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->edgePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nodePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodeRadiusQuantityName)._M_dataplus._M_p = (pointer)local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
  this->nodeRadiusQuantityAutoscale = true;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (local_280,
             (long)(pvVar7->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar7->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (local_278,
             (long)(pvVar7->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar7->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  sVar11 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                     ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00);
  local_2d0._M_dataplus._M_p = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f8,sVar11,
             (value_type_conflict1 *)&local_2d0,(allocator_type *)&local_270);
  puVar3 = (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_2a0 = &PTR_construction_vtable_24__005f4bd8;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2f8._M_dataplus._M_p;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_2f8._M_string_length;
  local_2f8._0_16_ = ZEXT816(0) << 0x20;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_2f8.field_2._M_allocated_capacity;
  local_2f8.field_2._M_allocated_capacity = 0;
  local_2b0 = this_01;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
    if (local_2f8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
  }
  local_2a8 = this_00;
  sVar11 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                     ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00);
  paVar13 = (pvVar7->
            super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  paVar17 = (pvVar7->
            super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_298 = this;
  if (paVar17 != paVar13) {
    __val_01 = 0;
    do {
      __val = paVar13[__val_01]._M_elems[0];
      __val_00 = paVar13[__val_01]._M_elems[1];
      (local_280->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[__val_01] = (uint)__val;
      (local_278->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[__val_01] = (uint)__val_00;
      if (sVar11 <= __val || sVar11 <= __val_00) {
        std::operator+(&local_b0,"CurveNetwork [",local_e0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_190 = &local_180;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_180 = *puVar16;
          lStack_178 = plVar10[3];
        }
        else {
          local_180 = *puVar16;
          local_190 = (ulong *)*plVar10;
        }
        local_188 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        cVar9 = '\x01';
        if (9 < __val_01) {
          uVar18 = __val_01;
          cVar8 = '\x04';
          do {
            cVar9 = cVar8;
            if (uVar18 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_0025e011;
            }
            if (uVar18 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_0025e011;
            }
            if (uVar18 < 10000) goto LAB_0025e011;
            bVar5 = 99999 < uVar18;
            uVar18 = uVar18 / 10000;
            cVar8 = cVar9 + '\x04';
          } while (bVar5);
          cVar9 = cVar9 + '\x01';
        }
LAB_0025e011:
        local_1b0 = local_1a0;
        std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar9);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1b0,local_1a8,__val_01);
        uVar18 = 0xf;
        if (local_190 != &local_180) {
          uVar18 = local_180;
        }
        uVar21 = CONCAT44(uStack_1a4,local_1a8) + local_188;
        if (uVar18 < uVar21) {
          uVar18 = 0xf;
          if (local_1b0 != local_1a0) {
            uVar18 = local_1a0[0];
          }
          if (uVar18 < uVar21) goto LAB_0025e0ab;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_190);
        }
        else {
LAB_0025e0ab:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_1b0);
        }
        local_250 = &local_240;
        puVar1 = puVar12 + 2;
        if ((undefined8 *)*puVar12 == puVar1) {
          local_240 = *puVar1;
          uStack_238 = puVar12[3];
        }
        else {
          local_240 = *puVar1;
          local_250 = (undefined8 *)*puVar12;
        }
        local_248 = puVar12[1];
        *puVar12 = puVar1;
        puVar12[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_170 = &local_160;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_160 = *puVar16;
          lStack_158 = plVar10[3];
        }
        else {
          local_160 = *puVar16;
          local_170 = (ulong *)*plVar10;
        }
        local_168 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        cVar9 = '\x01';
        if (9 < __val) {
          uVar18 = __val;
          cVar8 = '\x04';
          do {
            cVar9 = cVar8;
            if (uVar18 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_0025e1de;
            }
            if (uVar18 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_0025e1de;
            }
            if (uVar18 < 10000) goto LAB_0025e1de;
            bVar5 = 99999 < uVar18;
            uVar18 = uVar18 / 10000;
            cVar8 = cVar9 + '\x04';
          } while (bVar5);
          cVar9 = cVar9 + '\x01';
        }
LAB_0025e1de:
        local_1d0 = local_1c0;
        std::__cxx11::string::_M_construct((ulong)&local_1d0,cVar9);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1d0,local_1c8,__val);
        uVar18 = 0xf;
        if (local_170 != &local_160) {
          uVar18 = local_160;
        }
        uVar21 = CONCAT44(uStack_1c4,local_1c8) + local_168;
        if (uVar18 < uVar21) {
          uVar18 = 0xf;
          if (local_1d0 != local_1c0) {
            uVar18 = local_1c0[0];
          }
          if (uVar18 < uVar21) goto LAB_0025e278;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_170);
        }
        else {
LAB_0025e278:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_1d0);
        }
        local_230 = &local_220;
        puVar1 = puVar12 + 2;
        if ((undefined8 *)*puVar12 == puVar1) {
          local_220 = *puVar1;
          uStack_218 = puVar12[3];
        }
        else {
          local_220 = *puVar1;
          local_230 = (undefined8 *)*puVar12;
        }
        local_228 = puVar12[1];
        *puVar12 = puVar1;
        puVar12[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_230);
        local_150 = &local_140;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_140 = *puVar16;
          lStack_138 = plVar10[3];
        }
        else {
          local_140 = *puVar16;
          local_150 = (ulong *)*plVar10;
        }
        local_148 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        cVar9 = '\x01';
        if (9 < __val_00) {
          uVar18 = __val_00;
          cVar8 = '\x04';
          do {
            cVar9 = cVar8;
            if (uVar18 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_0025e3ab;
            }
            if (uVar18 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_0025e3ab;
            }
            if (uVar18 < 10000) goto LAB_0025e3ab;
            bVar5 = 99999 < uVar18;
            uVar18 = uVar18 / 10000;
            cVar8 = cVar9 + '\x04';
          } while (bVar5);
          cVar9 = cVar9 + '\x01';
        }
LAB_0025e3ab:
        local_1f0 = local_1e0;
        std::__cxx11::string::_M_construct((ulong)&local_1f0,cVar9);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1f0,local_1e8,__val_00);
        uVar18 = 0xf;
        if (local_150 != &local_140) {
          uVar18 = local_140;
        }
        uVar21 = CONCAT44(uStack_1e4,local_1e8) + local_148;
        if (uVar18 < uVar21) {
          uVar18 = 0xf;
          if (local_1f0 != local_1e0) {
            uVar18 = local_1e0[0];
          }
          if (uVar18 < uVar21) goto LAB_0025e445;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_150);
        }
        else {
LAB_0025e445:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_1f0);
        }
        local_270 = &local_260;
        puVar1 = puVar12 + 2;
        if ((undefined8 *)*puVar12 == puVar1) {
          local_260 = *puVar1;
          uStack_258 = puVar12[3];
        }
        else {
          local_260 = *puVar1;
          local_270 = (undefined8 *)*puVar12;
        }
        local_268 = puVar12[1];
        *puVar12 = puVar1;
        puVar12[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        puVar16 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_2d0.field_2._M_allocated_capacity = *puVar16;
          local_2d0.field_2._8_8_ = plVar10[3];
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *puVar16;
          local_2d0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_2d0._M_string_length = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        cVar9 = '\x01';
        if (9 < sVar11) {
          sVar19 = sVar11;
          cVar8 = '\x04';
          do {
            cVar9 = cVar8;
            if (sVar19 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_0025e569;
            }
            if (sVar19 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_0025e569;
            }
            if (sVar19 < 10000) goto LAB_0025e569;
            bVar5 = 99999 < sVar19;
            sVar19 = sVar19 / 10000;
            cVar8 = cVar9 + '\x04';
          } while (bVar5);
          cVar9 = cVar9 + '\x01';
        }
LAB_0025e569:
        local_210 = local_200;
        std::__cxx11::string::_M_construct((ulong)&local_210,cVar9);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_210,local_208,sVar11);
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          uVar20 = local_2d0.field_2._M_allocated_capacity;
        }
        uVar18 = CONCAT44(uStack_204,local_208) + local_2d0._M_string_length;
        if ((ulong)uVar20 < uVar18) {
          uVar21 = 0xf;
          if (local_210 != local_200) {
            uVar21 = local_200[0];
          }
          if (uVar21 < uVar18) goto LAB_0025e5f7;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_210,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
        }
        else {
LAB_0025e5f7:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_210);
        }
        local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
        psVar14 = puVar12 + 2;
        if ((size_type *)*puVar12 == psVar14) {
          local_2f8.field_2._M_allocated_capacity = *psVar14;
          local_2f8.field_2._8_8_ = puVar12[3];
        }
        else {
          local_2f8.field_2._M_allocated_capacity = *psVar14;
          local_2f8._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_2f8._M_string_length = puVar12[1];
        *puVar12 = psVar14;
        puVar12[1] = 0;
        *(undefined1 *)psVar14 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_2f8);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_120.field_2._M_allocated_capacity = *psVar14;
          local_120.field_2._8_8_ = plVar10[3];
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar14;
          local_120._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_120._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        exception(&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
          operator_delete(local_2f8._M_dataplus._M_p);
        }
        if (local_210 != local_200) {
          operator_delete(local_210);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0);
        }
        if (local_170 != &local_160) {
          operator_delete(local_170);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250);
        }
        if (local_1b0 != local_1a0) {
          operator_delete(local_1b0);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        paVar13 = (local_130->
                  super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        paVar17 = (local_130->
                  super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      __val_01 = __val_01 + 1;
      puVar4 = (local_128->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = puVar4 + __val;
      *puVar3 = *puVar3 + 1;
      puVar4 = puVar4 + __val_00;
      *puVar4 = *puVar4 + 1;
    } while (__val_01 < (ulong)((long)paVar17 - (long)paVar13 >> 4));
  }
  (*(local_298->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure
    [0x10])(local_298);
  return;
}

Assistant:

CurveNetwork::CurveNetwork(std::string name, std::vector<glm::vec3> nodes_, std::vector<std::array<size_t, 2>> edges_)
    : // clang-format off
      QuantityStructure<CurveNetwork>(name, typeName()), 
      nodePositions(this, uniquePrefix() + "nodePositions", nodePositionsData),
      edgeTailInds(this, uniquePrefix() + "edgeTailInds", edgeTailIndsData),
      edgeTipInds(this, uniquePrefix() + "edgeTipInds", edgeTipIndsData),
      edgeCenters(this, uniquePrefix() + "edgeCenters", edgeCentersData, std::bind(&CurveNetwork::computeEdgeCenters, this)),         
      nodePositionsData(std::move(nodes_)), 
      color(uniquePrefix() + "#color", getNextUniqueColor()), 
      radius(uniquePrefix() + "#radius", relativeValue(0.005)),
      material(uniquePrefix() + "#material", "clay")
// clang-format on
{

  // Copy interleaved data in to tip and tails buffers below
  edgeTailIndsData.resize(edges_.size());
  edgeTipIndsData.resize(edges_.size());

  // Compute node degrees; some quantities want them for visualizations
  nodeDegrees = std::vector<size_t>(nNodes(), 0);

  size_t maxInd = nodePositions.size();
  for (size_t iE = 0; iE < edges_.size(); iE++) {
    auto edge = edges_[iE];
    size_t nA = std::get<0>(edge);
    size_t nB = std::get<1>(edge);

    edgeTailIndsData[iE] = nA;
    edgeTipIndsData[iE] = nB;

    // Make sure there are no out of bounds indices
    if (nA >= maxInd || nB >= maxInd) {
      exception("CurveNetwork [" + name + "] edge " + std::to_string(iE) + " has bad node indices { " +
                std::to_string(nA) + " , " + std::to_string(nB) + " } but there are " + std::to_string(maxInd) +
                " nodes.");
    }

    // Increment degree
    nodeDegrees[nA]++;
    nodeDegrees[nB]++;
  }

  updateObjectSpaceBounds();
}